

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_test.cpp
# Opt level: O3

void test_files(shared_ptr<cppcms::sessions::session_storage> *storage,session_storage_factory *f)

{
  element_type *peVar1;
  int iVar2;
  time_t tVar3;
  ostream *poVar4;
  runtime_error *prVar5;
  string tstr;
  time_t ttime;
  ostringstream oss;
  undefined1 *local_200;
  undefined8 local_1f8;
  undefined1 local_1f0 [16];
  undefined1 *local_1e0 [2];
  undefined1 local_1d0 [16];
  long local_1c0;
  undefined1 *local_1b8 [2];
  undefined1 local_1a8 [360];
  shared_ptr<cppcms::sessions::session_storage> local_40;
  
  local_40.super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (storage->super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>
         )._M_ptr;
  local_40.super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (storage->super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_40.super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_40.super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_40.
            super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_40.super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_40.
            super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  test(&local_40,f);
  if (local_40.super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.
               super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  iVar2 = (*f->_vptr_session_storage_factory[1])();
  if ((char)iVar2 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/storage_test.cpp"
               ,0x5f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1b8,99);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," f.requires_gc()",0x10);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&local_200);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tVar3 = time((time_t *)0x0);
  peVar1 = (storage->
           super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1b8,bs_abi_cxx11_._M_dataplus._M_p,
             bs_abi_cxx11_._M_dataplus._M_p + bs_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)local_1b8);
  local_200 = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"test","");
  (**peVar1->_vptr_session_storage)(peVar1,local_1b8,tVar3,&local_200);
  if (local_200 != local_1f0) {
    operator_delete(local_200);
  }
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0]);
  }
  iVar2 = count_files();
  if (iVar2 != 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/storage_test.cpp"
               ,0x5f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1b8,0x66);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," count_files()==1",0x11);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&local_200);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  peVar1 = (storage->
           super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1b8,bs_abi_cxx11_._M_dataplus._M_p,
             bs_abi_cxx11_._M_dataplus._M_p + bs_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)local_1b8);
  (*peVar1->_vptr_session_storage[2])(peVar1,local_1b8);
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0]);
  }
  iVar2 = count_files();
  if (iVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/storage_test.cpp"
               ,0x5f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1b8,0x68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," count_files()==0",0x11);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&local_200);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  peVar1 = (storage->
           super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1b8,bs_abi_cxx11_._M_dataplus._M_p,
             bs_abi_cxx11_._M_dataplus._M_p + bs_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)local_1b8);
  local_200 = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"test","");
  (**peVar1->_vptr_session_storage)(peVar1,local_1b8,tVar3 + -1,&local_200);
  if (local_200 != local_1f0) {
    operator_delete(local_200);
  }
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0]);
  }
  peVar1 = (storage->
           super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1b8,bs_abi_cxx11_._M_dataplus._M_p,
             bs_abi_cxx11_._M_dataplus._M_p + bs_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)local_1b8);
  local_200 = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"test2","");
  (**peVar1->_vptr_session_storage)(peVar1,local_1b8,tVar3 + 1,&local_200);
  if (local_200 != local_1f0) {
    operator_delete(local_200);
  }
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0]);
  }
  iVar2 = count_files();
  if (iVar2 == 2) {
    (*f->_vptr_session_storage_factory[2])(f);
    iVar2 = count_files();
    if (iVar2 != 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/storage_test.cpp"
                 ,0x5f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1b8,0x6d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," count_files()==1",0x11);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,(string *)&local_200);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_1f8 = 0;
    local_1f0[0] = 0;
    peVar1 = (storage->
             super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    local_1b8[0] = local_1a8;
    local_200 = local_1f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1b8,bs_abi_cxx11_._M_dataplus._M_p,
               bs_abi_cxx11_._M_dataplus._M_p + bs_abi_cxx11_._M_string_length);
    std::__cxx11::string::append((char *)local_1b8);
    iVar2 = (*peVar1->_vptr_session_storage[1])(peVar1,local_1b8,&local_1c0,&local_200);
    if (local_1b8[0] != local_1a8) {
      operator_delete(local_1b8[0]);
    }
    if ((char)iVar2 == '\0') {
      peVar1 = (storage->
               super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      local_1b8[0] = local_1a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1b8,bs_abi_cxx11_._M_dataplus._M_p,
                 bs_abi_cxx11_._M_dataplus._M_p + bs_abi_cxx11_._M_string_length);
      std::__cxx11::string::append((char *)local_1b8);
      iVar2 = (*peVar1->_vptr_session_storage[1])(peVar1,local_1b8,&local_1c0,&local_200);
      if (local_1b8[0] != local_1a8) {
        operator_delete(local_1b8[0]);
      }
      if ((char)iVar2 == '\0') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/storage_test.cpp"
                   ,0x5f);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1b8,0x71);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4," storage->load(bs+\"2\",ttime,tstr)",0x21);
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar5,(string *)local_1e0);
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (local_1c0 == tVar3 + 1) {
        iVar2 = std::__cxx11::string::compare((char *)&local_200);
        if (iVar2 == 0) {
          peVar1 = (storage->
                   super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          local_1b8[0] = local_1a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1b8,bs_abi_cxx11_._M_dataplus._M_p,
                     bs_abi_cxx11_._M_dataplus._M_p + bs_abi_cxx11_._M_string_length);
          std::__cxx11::string::append((char *)local_1b8);
          local_1e0[0] = local_1d0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"test2","");
          (**peVar1->_vptr_session_storage)(peVar1,local_1b8,tVar3 + -1,local_1e0);
          if (local_1e0[0] != local_1d0) {
            operator_delete(local_1e0[0]);
          }
          if (local_1b8[0] != local_1a8) {
            operator_delete(local_1b8[0]);
          }
          iVar2 = count_files();
          if (iVar2 == 1) {
            (*f->_vptr_session_storage_factory[2])(f);
            iVar2 = count_files();
            if (iVar2 == 0) {
              if (local_200 != local_1f0) {
                operator_delete(local_200);
              }
              return;
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"Error ",6);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b8,
                       "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/storage_test.cpp"
                       ,0x5f);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1b8,0x76);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," count_files()==0",0x11);
            prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar5,(string *)local_1e0);
            __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"Error ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b8,
                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/storage_test.cpp"
                     ,0x5f);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1b8,0x74);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," count_files()==1",0x11);
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar5,(string *)local_1e0);
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/storage_test.cpp"
                 ,0x5f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1b8,0x72);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4," ttime==now+1 && tstr==\"test2\"",0x1e);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,(string *)local_1e0);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/storage_test.cpp"
               ,0x5f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1b8,0x70);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," !storage->load(bs+\"1\",ttime,tstr)",0x22);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)local_1e0);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"Error ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1b8,
             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/storage_test.cpp"
             ,0x5f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1b8,0x6b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," count_files()==2",0x11);
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar5,(string *)&local_200);
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_files(booster::shared_ptr<cppcms::sessions::session_storage> storage,
		cppcms::sessions::session_storage_factory &f)
{
	test(storage,f);
	TEST(f.requires_gc());
	time_t now=time(0);
	storage->save(bs+"1",now,"test");
	TEST(count_files()==1);
	storage->remove(bs+"1");
	TEST(count_files()==0);
	storage->save(bs+"1",now-1,"test");
	storage->save(bs+"2",now+1,"test2");
	TEST(count_files()==2);
	f.gc_job();
	TEST(count_files()==1);
	std::string tstr;
	time_t ttime;
	TEST(!storage->load(bs+"1",ttime,tstr));
	TEST(storage->load(bs+"2",ttime,tstr));
	TEST(ttime==now+1 && tstr=="test2");
	storage->save(bs+"2",now-1,"test2");
	TEST(count_files()==1);
	f.gc_job();
	TEST(count_files()==0);
}